

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool __thiscall
cmCMakePresetsGraphInternal::MatchesCondition::Evaluate
          (MatchesCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  ExpandMacroResult EVar4;
  string regexStr;
  string str;
  RegularExpression regex;
  string local_140;
  string local_120;
  RegularExpression local_100;
  
  pcVar1 = (this->String)._M_dataplus._M_p;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + (this->String)._M_string_length);
  EVar4 = anon_unknown.dwarf_ce93d7::ExpandMacros(&local_120,expanders,version);
  if (EVar4 == Ignore) {
    bVar2 = true;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar4 == Error) {
    bVar2 = false;
  }
  else {
    pcVar1 = (this->Regex)._M_dataplus._M_p;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar1,pcVar1 + (this->Regex)._M_string_length);
    EVar4 = anon_unknown.dwarf_ce93d7::ExpandMacros(&local_140,expanders,version);
    if (EVar4 == Ignore) {
      bVar2 = true;
      if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged = false;
      }
    }
    else if (EVar4 == Error) {
      bVar2 = false;
    }
    else {
      local_100.regmust = (char *)0x0;
      local_100.program = (char *)0x0;
      local_100.progsize = 0;
      memset(&local_100,0,0xaa);
      bVar2 = cmsys::RegularExpression::compile(&local_100,local_140._M_dataplus._M_p);
      if (bVar2) {
        bVar3 = cmsys::RegularExpression::find
                          (&local_100,local_120._M_dataplus._M_p,&local_100.regmatch);
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>
             = (_Optional_payload_base<bool>)(bVar3 | 0x100);
      }
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmCMakePresetsGraphInternal::MatchesCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);
  std::string regexStr = this->Regex;
  CHECK_EXPAND(out, regexStr, expanders, version);

  cmsys::RegularExpression regex;
  if (!regex.compile(regexStr)) {
    return false;
  }

  out = regex.find(str);
  return true;
}